

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

void copy_shortened_labels(ui_entry *dest,ui_entry *src)

{
  wchar_t *local_28;
  int local_1c;
  wchar_t i;
  ui_entry *src_local;
  ui_entry *dest_local;
  
  for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
    if (local_1c == 0) {
      local_28 = dest->shortened_buffer;
    }
    else {
      local_28 = dest->shortened_labels[local_1c + -1] + (long)local_1c + 1;
    }
    dest->shortened_labels[local_1c] = local_28;
    dest->nshortened[local_1c] = src->nshortened[local_1c];
    if (L'\0' < src->nshortened[local_1c]) {
      memcpy(dest->shortened_labels[local_1c],src->shortened_labels[local_1c],
             (long)(src->nshortened[local_1c] + L'\x01') << 2);
    }
  }
  return;
}

Assistant:

static void copy_shortened_labels(struct ui_entry *dest,
	const struct ui_entry *src)
{
	int i;

	for (i = 0; i < MAX_SHORTENED; ++i) {
		dest->shortened_labels[i] = (i == 0) ? dest->shortened_buffer :
			dest->shortened_labels[i - 1] + i + 1;
		dest->nshortened[i] = src->nshortened[i];
		if (src->nshortened[i] > 0) {
			(void) memcpy(dest->shortened_labels[i],
				src->shortened_labels[i],
				(src->nshortened[i] + 1) *
				sizeof(*dest->shortened_labels[i]));
		}
	}
}